

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void raise_mmu_exception(CPURISCVState_conflict1 *env,target_ulong address,MMUAccessType access_type
                        ,_Bool pmp_violation,_Bool first_stage)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined3 in_register_00000081;
  bool bVar5;
  
  lVar2 = 0x328;
  if ((CONCAT31(in_register_00000081,first_stage) == 0) || (lVar2 = 0x2a0, 0x10fff < env->priv_ver))
  {
    bVar3 = !pmp_violation && *(ulong *)((long)env->gpr + lVar2) >> 0x3c != 0;
  }
  else {
    bVar3 = false;
  }
  if (access_type == MMU_DATA_LOAD) {
    bVar5 = true;
    if ((env->misa & 0x80) != 0) {
      bVar5 = (env->virt & 1) == 0;
    }
    iVar4 = (uint)bVar3 * 8 + 5;
    iVar1 = 0x15;
  }
  else if (access_type == MMU_DATA_STORE) {
    bVar5 = true;
    if ((env->misa & 0x80) != 0) {
      bVar5 = (env->virt & 1) == 0;
    }
    iVar4 = (uint)bVar3 * 8 + 7;
    iVar1 = 0x17;
  }
  else {
    if (access_type != MMU_INST_FETCH) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                 ,0x273,(char *)0x0);
    }
    bVar5 = true;
    if ((env->misa & 0x80) != 0) {
      bVar5 = (env->virt & 1) == 0;
    }
    iVar4 = 1;
    if (bVar3 != false) {
      iVar4 = 0xc;
    }
    iVar1 = 0x14;
  }
  if (first_stage) {
    iVar1 = iVar4;
  }
  if (bVar5) {
    iVar1 = iVar4;
  }
  *(int *)(env[-2].gpr + 0x1a) = iVar1;
  env->badaddr = address;
  return;
}

Assistant:

static void raise_mmu_exception(CPUMIPSState *env, target_ulong address,
                                int rw, int tlb_error)
{
    CPUState *cs = env_cpu(env);
    int exception = 0, error_code = 0;

    if (rw == MMU_INST_FETCH) {
        error_code |= EXCP_INST_NOTAVAIL;
    }

    switch (tlb_error) {
    default:
    case TLBRET_BADADDR:
        /* Reference to kernel address from user mode or supervisor mode */
        /* Reference to supervisor address from user mode */
        if (rw == MMU_DATA_STORE) {
            exception = EXCP_AdES;
        } else {
            exception = EXCP_AdEL;
        }
        break;
    case TLBRET_NOMATCH:
        /* No TLB match for a mapped address */
        if (rw == MMU_DATA_STORE) {
            exception = EXCP_TLBS;
        } else {
            exception = EXCP_TLBL;
        }
        error_code |= EXCP_TLB_NOMATCH;
        break;
    case TLBRET_INVALID:
        /* TLB match with no valid bit */
        if (rw == MMU_DATA_STORE) {
            exception = EXCP_TLBS;
        } else {
            exception = EXCP_TLBL;
        }
        break;
    case TLBRET_DIRTY:
        /* TLB match but 'D' bit is cleared */
        exception = EXCP_LTLBL;
        break;
    case TLBRET_XI:
        /* Execute-Inhibit Exception */
        if (env->CP0_PageGrain & (1 << CP0PG_IEC)) {
            exception = EXCP_TLBXI;
        } else {
            exception = EXCP_TLBL;
        }
        break;
    case TLBRET_RI:
        /* Read-Inhibit Exception */
        if (env->CP0_PageGrain & (1 << CP0PG_IEC)) {
            exception = EXCP_TLBRI;
        } else {
            exception = EXCP_TLBL;
        }
        break;
    }
    /* Raise exception */
    if (!(env->hflags & MIPS_HFLAG_DM)) {
        env->CP0_BadVAddr = address;
    }
    env->CP0_Context = (env->CP0_Context & ~0x007fffff) |
                       ((address >> 9) & 0x007ffff0);
    env->CP0_EntryHi = (env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask) |
                       (env->CP0_EntryHi & (1 << CP0EnHi_EHINV)) |
                       (address & (TARGET_PAGE_MASK << 1));
#if defined(TARGET_MIPS64)
    env->CP0_EntryHi &= env->SEGMask;
    env->CP0_XContext =
        (env->CP0_XContext & ((~0ULL) << (env->SEGBITS - 7))) | /* PTEBase */
        (extract64(address, 62, 2) << (env->SEGBITS - 9)) |     /* R       */
        (extract64(address, 13, env->SEGBITS - 13) << 4);       /* BadVPN2 */
#endif
    cs->exception_index = exception;
    env->error_code = error_code;
}